

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxCollision.h
# Opt level: O2

void __thiscall cbtAABB::merge(cbtAABB *this,cbtAABB *box)

{
  float fVar1;
  undefined1 auVar2 [16];
  cbtAABB *pcVar3;
  cbtVector3 *pcVar4;
  
  auVar2 = vminss_avx(ZEXT416((uint)(box->m_min).m_floats[0]),
                      ZEXT416((uint)(this->m_min).m_floats[0]));
  (this->m_min).m_floats[0] = auVar2._0_4_;
  fVar1 = (this->m_min).m_floats[2];
  pcVar3 = this;
  if ((box->m_min).m_floats[1] < (this->m_min).m_floats[1]) {
    pcVar3 = box;
  }
  (this->m_min).m_floats[1] = (pcVar3->m_min).m_floats[1];
  pcVar3 = this;
  if ((box->m_min).m_floats[2] < fVar1) {
    pcVar3 = box;
  }
  (this->m_min).m_floats[2] = (pcVar3->m_min).m_floats[2];
  auVar2 = vmaxss_avx(ZEXT416((uint)(box->m_max).m_floats[0]),
                      ZEXT416((uint)(this->m_max).m_floats[0]));
  (this->m_max).m_floats[0] = auVar2._0_4_;
  pcVar4 = &this->m_max;
  if ((this->m_max).m_floats[1] < (box->m_max).m_floats[1]) {
    pcVar4 = &box->m_max;
  }
  (this->m_max).m_floats[1] = pcVar4->m_floats[1];
  pcVar4 = &this->m_max;
  if ((this->m_max).m_floats[2] < (box->m_max).m_floats[2]) {
    pcVar4 = &box->m_max;
  }
  (this->m_max).m_floats[2] = pcVar4->m_floats[2];
  return;
}

Assistant:

SIMD_FORCE_INLINE void merge(const cbtAABB &box)
	{
		m_min[0] = BT_MIN(m_min[0], box.m_min[0]);
		m_min[1] = BT_MIN(m_min[1], box.m_min[1]);
		m_min[2] = BT_MIN(m_min[2], box.m_min[2]);

		m_max[0] = BT_MAX(m_max[0], box.m_max[0]);
		m_max[1] = BT_MAX(m_max[1], box.m_max[1]);
		m_max[2] = BT_MAX(m_max[2], box.m_max[2]);
	}